

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

CharFormat testing::internal::PrintCharsAsStringTo<char32_t>(char32_t *begin,size_t len,ostream *os)

{
  char32_t c;
  int iVar1;
  CharFormat CVar2;
  ostream *poVar3;
  size_t sVar4;
  uchar low_byte;
  bool bVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"U",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  if (len != 0) {
    bVar5 = false;
    sVar4 = 0;
    do {
      c = begin[sVar4];
      if ((bool)((uint)c < 0x100 & bVar5)) {
        iVar1 = isxdigit(c);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\" ",2);
          std::__ostream_insert<char,std::char_traits<char>>(os,"U",1);
          std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
        }
      }
      CVar2 = PrintAsStringLiteralTo(c,os);
      bVar5 = CVar2 == kHexEscape;
      sVar4 = sVar4 + 1;
    } while (len != sVar4);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  return (CharFormat)poVar3;
}

Assistant:

static CharFormat PrintCharsAsStringTo(
    const CharType* begin, size_t len, ostream* os) {
  const char* const quote_prefix = GetCharWidthPrefix(*begin);
  *os << quote_prefix << "\"";
  bool is_previous_hex = false;
  CharFormat print_format = kAsIs;
  for (size_t index = 0; index < len; ++index) {
    const CharType cur = begin[index];
    if (is_previous_hex && IsXDigit(cur)) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" " << quote_prefix << "\"";
    }
    is_previous_hex = PrintAsStringLiteralTo(cur, os) == kHexEscape;
    // Remember if any characters required hex escaping.
    if (is_previous_hex) {
      print_format = kHexEscape;
    }
  }
  *os << "\"";
  return print_format;
}